

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chartype.c
# Opt level: O2

char * ct_encode_string(wchar_t *s,ct_buffer_t *conv)

{
  ulong uVar1;
  char *__ptr;
  char *dst;
  ssize_t sVar2;
  long lVar3;
  
  if (s == (wchar_t *)0x0) {
    return (char *)0x0;
  }
  __ptr = conv->cbuff;
  dst = __ptr;
  while( true ) {
    lVar3 = (long)dst - (long)__ptr;
    uVar1 = conv->csize;
    if (uVar1 - lVar3 < 5) {
      if (uVar1 < 0xfffffffffffffc00) {
        conv->csize = uVar1 + 0x400;
        __ptr = (char *)realloc(__ptr,uVar1 + 0x400);
        if (__ptr == (char *)0x0) {
          conv->csize = 0;
          free(conv->cbuff);
          conv->cbuff = (char *)0x0;
          return (char *)0x0;
        }
        conv->cbuff = __ptr;
      }
      dst = __ptr + lVar3;
    }
    if (*s == L'\0') break;
    sVar2 = ct_encode_char(dst,5,*s);
    if (sVar2 == -1) {
      abort();
    }
    s = s + 1;
    dst = dst + sVar2;
    __ptr = conv->cbuff;
  }
  *dst = '\0';
  return conv->cbuff;
}

Assistant:

char *
ct_encode_string(const wchar_t *s, ct_buffer_t *conv)
{
	char *dst;
	ssize_t used;

	if (!s)
		return NULL;

	dst = conv->cbuff;
	for (;;) {
		used = (ssize_t)(dst - conv->cbuff);
		if ((conv->csize - (size_t)used) < 5) {
			if (ct_conv_cbuff_resize(conv,
			    conv->csize + CT_BUFSIZ) == -1)
				return NULL;
			dst = conv->cbuff + used;
		}
		if (!*s)
			break;
		used = ct_encode_char(dst, (size_t)5, *s);
		if (used == -1) /* failed to encode, need more buffer space */
			abort();
		++s;
		dst += used;
	}
	*dst = '\0';
	return conv->cbuff;
}